

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  ulong uVar1;
  int iVar2;
  int local_84;
  int i;
  int exec_errorno;
  int err;
  pid_t pid;
  int stdio_count;
  int (*pipes) [2];
  int pipes_storage [8] [2];
  uv_process_options_t *options_local;
  uv_process_t *process_local;
  uv_loop_t *loop_local;
  
  pipes_storage[7] = (int  [2])options;
  if ((options->cpumask != (char *)0x0) &&
     (uVar1 = options->cpumask_size, iVar2 = uv_cpumask_size(), uVar1 < (ulong)(long)iVar2)) {
    return -0x16;
  }
  if (*(long *)((long)pipes_storage[7] + 8) == 0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x3ed,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if ((*(uint *)((long)pipes_storage[7] + 0x28) & 0xffffff80) != 0) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x3f4,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  process->handle_queue[1] = loop->handle_queue[1];
  *(void ***)process->handle_queue[1] = process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  process->queue[0] = process->queue;
  process->queue[1] = process->queue;
  process->status = 0;
  err = *(int *)((long)pipes_storage[7] + 0x2c);
  if (err < 3) {
    err = 3;
  }
  i = -0xc;
  _pid = (int (*) [2])&pipes;
  if (8 < err) {
    _pid = (int (*) [2])uv__malloc((long)err << 3);
  }
  if (_pid != (int (*) [2])0x0) {
    for (local_84 = 0; local_84 < err; local_84 = local_84 + 1) {
      _pid[local_84][0] = -1;
      _pid[local_84][1] = -1;
    }
    for (local_84 = 0; local_84 < *(int *)((long)pipes_storage[7] + 0x2c); local_84 = local_84 + 1)
    {
      i = uv__process_init_stdio
                    ((uv_stdio_container_t *)
                     (*(long *)((long)pipes_storage[7] + 0x30) + (long)local_84 * 0x10),
                     _pid[local_84]);
      if (i != 0) goto LAB_00391228;
    }
    uv_signal_start(&loop->child_watcher,uv__chld,0x11);
    iVar2 = uv__spawn_and_init_child
                      (loop,(uv_process_options_t *)pipes_storage[7],err,_pid,&exec_errorno);
    if (iVar2 == 0) {
      process->pid = exec_errorno;
      process->exit_cb = *(uv_exit_cb *)pipes_storage[7];
      process->queue[0] = loop->process_handles;
      process->queue[1] = loop->process_handles[1];
      *(void ***)process->queue[1] = process->queue;
      loop->process_handles[1] = process->queue;
      if (((process->flags & 4) == 0) &&
         (process->flags = process->flags | 4, (process->flags & 8) != 0)) {
        process->loop->active_handles = process->loop->active_handles + 1;
      }
    }
    local_84 = 0;
    while( true ) {
      if (*(int *)((long)pipes_storage[7] + 0x2c) <= local_84) {
        if (_pid == (int (*) [2])&pipes) {
          return iVar2;
        }
        uv__free(_pid);
        return iVar2;
      }
      i = uv__process_open_stream
                    ((uv_stdio_container_t *)
                     (*(long *)((long)pipes_storage[7] + 0x30) + (long)local_84 * 0x10),
                     _pid[local_84]);
      if (i != 0) break;
      local_84 = local_84 + 1;
    }
    while (local_84 != 0) {
      uv__process_close_stream
                ((uv_stdio_container_t *)
                 (*(long *)((long)pipes_storage[7] + 0x30) + (long)(local_84 + -1) * 0x10));
      local_84 = local_84 + -1;
    }
  }
LAB_00391228:
  if (_pid != (int (*) [2])0x0) {
    for (local_84 = 0; local_84 < err; local_84 = local_84 + 1) {
      if ((*(int *)((long)pipes_storage[7] + 0x2c) <= local_84) ||
         ((*(uint *)(*(long *)((long)pipes_storage[7] + 0x30) + (long)local_84 * 0x10) & 6) == 0)) {
        if (_pid[local_84][0] != -1) {
          uv__close_nocheckstdio(_pid[local_84][0]);
        }
        if (_pid[local_84][1] != -1) {
          uv__close_nocheckstdio(_pid[local_84][1]);
        }
      }
    }
    if (_pid != (int (*) [2])&pipes) {
      uv__free(_pid);
    }
  }
  return i;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  if (options->cpumask != NULL) {
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
    if (options->cpumask_size < (size_t)uv_cpumask_size()) {
      return UV_EINVAL;
    }
#else
    return UV_ENOTSUP;
#endif
#else
    return UV_ENOTSUP;
#endif
  }

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);
  process->status = 0;

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

#ifdef UV_USE_SIGCHLD
  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);
#endif

  /* Spawn the child */
  exec_errorno = uv__spawn_and_init_child(loop, options, stdio_count, pipes, &pid);

#if 0
  /* This runs into a nodejs issue (it expects initialized streams, even if the
   * exec failed).
   * See https://github.com/libuv/libuv/pull/3107#issuecomment-782482608 */
  if (exec_errorno != 0)
      goto error;
#endif

  /* Activate this handle if exec() happened successfully, even if we later
   * fail to open a stdio handle. This ensures we can eventually reap the child
   * with waitpid. */
  if (exec_errorno == 0) {
#ifndef UV_USE_SIGCHLD
    struct kevent event;
    EV_SET(&event, pid, EVFILT_PROC, EV_ADD | EV_ONESHOT, NOTE_EXIT, 0, 0);
    if (kevent(loop->backend_fd, &event, 1, NULL, 0, NULL)) {
      if (errno != ESRCH)
        abort();
      /* Process already exited. Call waitpid on the next loop iteration. */
      process->flags |= UV_HANDLE_REAP;
      loop->flags |= UV_LOOP_REAP_CHILDREN;
    }
#endif

    process->pid = pid;
    process->exit_cb = options->exit_cb;
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}